

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void Vaxpy_Serial(realtype a,N_Vector x,N_Vector y)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = *x->content;
  uVar4 = (ulong)uVar1;
  lVar2 = *(long *)((long)x->content + 8);
  lVar3 = *(long *)((long)y->content + 8);
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          *(double *)(lVar3 + uVar5 * 8) =
               *(double *)(lVar2 + uVar5 * 8) * a + *(double *)(lVar3 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
    }
    else if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        *(double *)(lVar3 + uVar5 * 8) =
             *(double *)(lVar3 + uVar5 * 8) - *(double *)(lVar2 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  else if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      *(double *)(lVar3 + uVar5 * 8) =
           *(double *)(lVar2 + uVar5 * 8) + *(double *)(lVar3 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

static void Vaxpy_Serial(realtype a, N_Vector x, N_Vector y)
{
  sunindextype i, N;
  realtype *xd, *yd;

  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  if (a == ONE) {
    for (i = 0; i < N; i++)
      yd[i] += xd[i];
    return;
  }

  if (a == -ONE) {
    for (i = 0; i < N; i++)
      yd[i] -= xd[i];
    return;
  }

  for (i = 0; i < N; i++)
    yd[i] += a*xd[i];

  return;
}